

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector4D.cpp
# Opt level: O0

ostream * CMU462::operator<<(ostream *os,Vector4D *v)

{
  ostream *poVar1;
  Vector4D *v_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->y);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->z);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->w);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const Vector4D& v ) {
    os << "(" << v.x << "," << v.y << "," << v.z << "," << v.w << ")";
    return os;
  }